

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.h
# Opt level: O2

bool __thiscall RoomInfo::operator==(RoomInfo *this,RoomInfo *room)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,&this->flatname,&this->roomname);
  std::operator+(&local_60,&room->flatname,&room->roomname);
  _Var1 = std::operator==(&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return _Var1;
}

Assistant:

bool operator==(const RoomInfo& room) const
	{
		return flatname + roomname == room.flatname + room.roomname;
	}